

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content-parser.c
# Opt level: O1

void htmlentities_append(bc_string_t *str,char c)

{
  bool bVar1;
  char *suffix;
  int iVar2;
  undefined7 in_register_00000031;
  
  iVar2 = (int)CONCAT71(in_register_00000031,c);
  if (iVar2 < 0x2f) {
    if (iVar2 == 0x22) {
      suffix = "&quot;";
    }
    else if (iVar2 == 0x26) {
      suffix = "&amp;";
    }
    else {
      if (iVar2 != 0x27) {
LAB_00106357:
        bVar1 = true;
        suffix = (char *)0x0;
        goto LAB_0010636f;
      }
      suffix = "&#x27;";
    }
  }
  else if (iVar2 == 0x2f) {
    suffix = "&#x2F;";
  }
  else if (iVar2 == 0x3e) {
    suffix = "&gt;";
  }
  else {
    if (iVar2 != 0x3c) goto LAB_00106357;
    suffix = "&lt;";
  }
  bVar1 = false;
LAB_0010636f:
  if (bVar1) {
    bc_string_append_c(str,c);
    return;
  }
  bc_string_append(str,suffix);
  return;
}

Assistant:

static void
htmlentities_append(bc_string_t *str, char c)
{
    const char *e = htmlentities(c);
    if (e == NULL)
        bc_string_append_c(str, c);
    else
        bc_string_append(str, e);
}